

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type1Input.cpp
# Opt level: O2

string * __thiscall
Type1Input::GetGlyphCharStringName_abi_cxx11_
          (string *__return_storage_ptr__,Type1Input *this,Byte inCharStringIndex)

{
  char *__s;
  StandardEncoding standardEncoding;
  StandardEncoding local_1b;
  allocator<char> local_1a;
  allocator<char> local_19;
  
  if ((this->mEncoding).EncodingType == eType1EncodingTypeCustom) {
    if ((this->mEncoding).mCustomEncoding[inCharStringIndex]._M_string_length == 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,".notdef",&local_19);
    }
    else {
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,
                 (string *)((this->mEncoding).mCustomEncoding + inCharStringIndex));
    }
  }
  else {
    StandardEncoding::StandardEncoding(&local_1b);
    __s = StandardEncoding::GetEncodedGlyphName(&local_1b,inCharStringIndex);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,__s,&local_1a);
    StandardEncoding::~StandardEncoding(&local_1b);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Type1Input::GetGlyphCharStringName(Byte inCharStringIndex)
{
	if(eType1EncodingTypeCustom == mEncoding.EncodingType)
	{
		if(mEncoding.mCustomEncoding[inCharStringIndex].size() == 0)
			return ".notdef";
		else
			return mEncoding.mCustomEncoding[inCharStringIndex];
	}
	else
	{
		StandardEncoding standardEncoding;

		return standardEncoding.GetEncodedGlyphName(inCharStringIndex);
	}
}